

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 crnd::utils::compute_max_mips(uint32 width,uint32 height)

{
  uint32 uVar1;
  
  if (height == 0 && width == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 1;
    for (; 1 < height || 1 < width; height = height >> 1) {
      width = width >> 1;
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

uint32 compute_max_mips(uint32 width, uint32 height)
        {
            if ((width | height) == 0)
                return 0;

            uint32 num_mips = 1;

            while ((width > 1U) || (height > 1U))
            {
                width >>= 1U;
                height >>= 1U;
                num_mips++;
            }

            return num_mips;
        }